

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O3

int Tas_ManResolve(Tas_Man_t *p,int Level,int hClause0,int hClause1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t **ppGVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  Gia_Obj_t *pGVar9;
  int iVar10;
  
  ppGVar4 = (p->pClauses).pData;
  lVar8 = (long)Level;
  if (ppGVar4[lVar8] == (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[hClause0] != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x36e,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
  }
  lVar7 = (long)hClause0;
  if (ppGVar4[lVar8] != ppGVar4[lVar7]) {
    __assert_fail("pQue->pData[hClause0] == pQue->pData[hClause1]",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x36f,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
  }
  iVar6 = (p->pClauses).iHead;
  if (iVar6 != (p->pClauses).iTail) {
    __assert_fail("Tas_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x376,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
  }
  if (iVar6 == (p->pClauses).nSize) {
    (p->pClauses).nSize = iVar6 * 2;
    ppGVar4 = (Gia_Obj_t **)realloc(ppGVar4,(long)iVar6 << 4);
    iVar6 = (p->pClauses).iTail;
    (p->pClauses).pData = ppGVar4;
  }
  iVar5 = iVar6 + 1;
  (p->pClauses).iTail = iVar5;
  ppGVar4[iVar6] = (Gia_Obj_t *)0x0;
  ppGVar4 = (p->pClauses).pData;
  pGVar9 = ppGVar4[lVar8 + 1];
  if (pGVar9 == (Gia_Obj_t *)0x0) {
    iVar6 = -1;
  }
  else {
    lVar8 = (lVar8 + 1) * 8;
    iVar6 = -1;
    do {
      lVar8 = lVar8 + 8;
      if (-1 < (long)*(ulong *)pGVar9) {
        *(ulong *)pGVar9 = *(ulong *)pGVar9 | 0x8000000000000000;
        iVar10 = (p->pClauses).iTail;
        if (iVar10 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar10 * 2;
          ppGVar4 = (p->pClauses).pData;
          if (ppGVar4 == (Gia_Obj_t **)0x0) {
            ppGVar4 = (Gia_Obj_t **)malloc((long)iVar10 << 4);
          }
          else {
            ppGVar4 = (Gia_Obj_t **)realloc(ppGVar4,(long)iVar10 << 4);
            iVar10 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = ppGVar4;
        }
        else {
          ppGVar4 = (p->pClauses).pData;
        }
        iVar5 = iVar10 + 1;
        (p->pClauses).iTail = iVar5;
        ppGVar4[iVar10] = pGVar9;
        uVar1 = pGVar9->Value;
        if (uVar1 == 0xffffffff) goto LAB_0069deaa;
        uVar3 = uVar1 * 3;
        if ((int)uVar3 < 0) goto LAB_0069de8b;
        uVar2 = p->vLevReas->nSize;
        if (uVar2 == uVar3 || SBORROW4(uVar2,uVar3) != (int)(uVar2 + uVar1 * -3) < 0)
        goto LAB_0069de8b;
        iVar10 = p->vLevReas->pArray[uVar3];
        if (iVar6 <= iVar10) {
          iVar6 = iVar10;
        }
        ppGVar4 = (p->pClauses).pData;
      }
      pGVar9 = *(Gia_Obj_t **)((long)ppGVar4 + lVar8);
    } while (pGVar9 != (Gia_Obj_t *)0x0);
  }
  pGVar9 = ppGVar4[lVar7 + 1];
  if (pGVar9 != (Gia_Obj_t *)0x0) {
    lVar8 = (lVar7 + 1) * 8;
    do {
      lVar8 = lVar8 + 8;
      if (-1 < (long)*(ulong *)pGVar9) {
        *(ulong *)pGVar9 = *(ulong *)pGVar9 | 0x8000000000000000;
        iVar10 = (p->pClauses).iTail;
        if (iVar10 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar10 * 2;
          ppGVar4 = (p->pClauses).pData;
          if (ppGVar4 == (Gia_Obj_t **)0x0) {
            ppGVar4 = (Gia_Obj_t **)malloc((long)iVar10 << 4);
          }
          else {
            ppGVar4 = (Gia_Obj_t **)realloc(ppGVar4,(long)iVar10 << 4);
            iVar10 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = ppGVar4;
        }
        else {
          ppGVar4 = (p->pClauses).pData;
        }
        iVar5 = iVar10 + 1;
        (p->pClauses).iTail = iVar5;
        ppGVar4[iVar10] = pGVar9;
        uVar1 = pGVar9->Value;
        if (uVar1 == 0xffffffff) {
LAB_0069deaa:
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                        ,0x83,"int Tas_VarDecLevel(Tas_Man_t *, Gia_Obj_t *)");
        }
        uVar3 = uVar1 * 3;
        if ((int)uVar3 < 0) {
LAB_0069de8b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = p->vLevReas->nSize;
        if (uVar2 == uVar3 || SBORROW4(uVar2,uVar3) != (int)(uVar2 + uVar1 * -3) < 0)
        goto LAB_0069de8b;
        iVar10 = p->vLevReas->pArray[uVar3];
        if (iVar6 <= iVar10) {
          iVar6 = iVar10;
        }
        ppGVar4 = (p->pClauses).pData;
      }
      pGVar9 = *(Gia_Obj_t **)((long)ppGVar4 + lVar8);
    } while (pGVar9 != (Gia_Obj_t *)0x0);
  }
  iVar10 = (p->pClauses).iHead;
  if (iVar10 + 1 < iVar5) {
    lVar8 = (long)iVar10 + 1;
    do {
      pGVar9 = (p->pClauses).pData[lVar8];
      *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0x7fffffffffffffff;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->pClauses).iTail);
  }
  Tas_ManDeriveReason(p,iVar6);
  iVar6 = (p->pClauses).iHead;
  iVar5 = (p->pClauses).iTail;
  if (iVar5 <= iVar6) {
    __assert_fail("p->iHead < p->iTail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x1a5,"int Tas_QueFinish(Tas_Que_t *)");
  }
  if (iVar5 == (p->pClauses).nSize) {
    (p->pClauses).nSize = iVar5 * 2;
    ppGVar4 = (p->pClauses).pData;
    if (ppGVar4 == (Gia_Obj_t **)0x0) {
      ppGVar4 = (Gia_Obj_t **)malloc((long)iVar5 << 4);
    }
    else {
      ppGVar4 = (Gia_Obj_t **)realloc(ppGVar4,(long)iVar5 << 4);
      iVar5 = (p->pClauses).iTail;
    }
    (p->pClauses).pData = ppGVar4;
  }
  else {
    ppGVar4 = (p->pClauses).pData;
  }
  (p->pClauses).iTail = iVar5 + 1;
  ppGVar4[iVar5] = (Gia_Obj_t *)0x0;
  (p->pClauses).iHead = iVar5 + 1;
  return iVar6;
}

Assistant:

static inline int Tas_ManResolve( Tas_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj;
    int i, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0] != NULL );
    assert( pQue->pData[hClause0] == pQue->pData[hClause1] );
/*
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fPhase == 0 );
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fPhase == 0 );
*/
    assert( Tas_QueIsEmpty( pQue ) );
    Tas_QuePush( pQue, NULL );
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Tas_QuePush( pQue, pObj );
        LevelCur = Tas_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Tas_QuePush( pQue, pObj );
        LevelCur = Tas_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
        pQue->pData[i]->fPhase = 0;
    Tas_ManDeriveReason( p, LevelMax );
    return Tas_QueFinish( pQue );
}